

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O2

void __thiscall VehicleState::Propagator::OE2State(Propagator *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double __x;
  initializer_list<int> __l;
  double local_148;
  _Vector_base<int,_std::allocator<int>_> local_130;
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  double local_f8;
  vector<int,_std::allocator<int>_> order;
  Vector3d vel;
  Vector3d pos;
  Matrix3d *local_a0;
  Matrix<double,_3,_1,_0,_3,_1> *local_98;
  Matrix3d R;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  Matrix<double,_3,_1,_0,_3,_1> local_30;
  
  dVar1 = this->mu_;
  dVar2 = this->e_;
  __x = (this->nu_ * 180.0) / 3.141592653589793;
  dVar7 = this->a_;
  dVar3 = this->periap_;
  local_118 = this->i_;
  dStack_110 = this->ascend_;
  dVar5 = cos(__x);
  dVar6 = cos(__x);
  dVar7 = (dVar6 * dVar2 + 1.0) * (((1.0 - dVar2 * dVar2) * dVar7) / (dVar5 * dVar2 + 1.0)) * dVar1;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar5 = cos(__x);
  local_30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       sin(__x);
  local_30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar5;
  dVar5 = cos(__x);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (dVar7 * dVar7) / ((dVar5 * dVar2 + 1.0) * dVar1);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_30;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_30,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&R);
  local_148 = sin(__x);
  local_148 = -local_148;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       cos(__x);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] + dVar2;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_148;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar1 / dVar7;
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_48;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_48,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&R);
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.12199579244747e-314;
  R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_ = 3
  ;
  __l._M_len = 3;
  __l._M_array = (iterator)&R;
  std::vector<int,_std::allocator<int>_>::vector(&order,__l,(allocator_type *)&pos);
  auVar8._0_8_ = dStack_110 * 3.141592653589793;
  auVar8._8_8_ = local_118 * 3.141592653589793;
  auVar4._8_4_ = (int)DAT_001335a0;
  auVar4._0_8_ = DAT_001335a0._8_8_;
  auVar4._12_4_ = DAT_001335a0._4_4_;
  local_108 = divpd(auVar8,auVar4);
  local_f8 = (dVar3 * 3.141592653589793) / 180.0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_130,&order);
  Util::Angle2RotM(&R,(Vector3d *)local_108,(vector<int,_std::allocator<int>_> *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_130);
  vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&R;
  vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&local_30;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pos,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&vel);
  local_a0 = &R;
  local_98 = &local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&vel,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&order.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Propagator::OE2State(){

		//extract locals
		double mu = this->mu_; // gravity constant
		double a = this->a_; //semi-major axis
		double e = this->e_; //eccentricity
		double i = this->i_; //inclination
		double Ohm = this->ascend_; //longitude of ascending node
		double w = this->periap_; //argument of periapsis
		double nu = this->nu_; //true anomaly

		//convert true anomaly to radian
		double nu_rad = nu*180.0/M_PI;

		//calculate the norm of position
		double nr = a*(1.0 - pow(e,2)) / (1 + e*cos(nu_rad));

		//angular velocity
		double h = sqrt(mu*nr*(1+e*cos(nu_rad)));

		// radius in perifocal reference frame
		Eigen::Vector3d r_pqw(cos(nu_rad), sin(nu_rad), 0.0);
		r_pqw = pow(h,2)/(mu*(1+e*cos(nu_rad)))*r_pqw;

		// velocity in perifocal reference frame
		Eigen::Vector3d v_pqw(-sin(nu_rad), e+cos(nu_rad), 0);
		v_pqw = v_pqw*(mu/h);

		// generate 313 rotation matric from perifocal to geocentric vector rotation
		Eigen::Vector3d angles(M_PI*Ohm/180, M_PI*i/180, M_PI*w/180);
		std::vector<int> order{3,1,3};
		Eigen::Matrix3d R = Util::Angle2RotM(angles, order);

		// rotate vectors
		Eigen::Vector3d pos = R*r_pqw;
		Eigen::Vector3d vel = R*v_pqw;

		//Display
		// std::cout << "position: \n" << pos << std::endl;
		// std::cout << "velocity: \n" << vel << std::endl;

		//Assign

	}